

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldPtrsIteratorTest_MutableConstPtrIteration_Test::
~RepeatedPtrFieldPtrsIteratorTest_MutableConstPtrIteration_Test
          (RepeatedPtrFieldPtrsIteratorTest_MutableConstPtrIteration_Test *this)

{
  RepeatedPtrFieldPtrsIteratorTest::~RepeatedPtrFieldPtrsIteratorTest
            (&this->super_RepeatedPtrFieldPtrsIteratorTest);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST_F(RepeatedPtrFieldPtrsIteratorTest, MutableConstPtrIteration) {
  RepeatedPtrField<std::string>::const_pointer_iterator iter =
      const_proto_array_->pointer_begin();
  EXPECT_EQ("foo", **iter);
  ++iter;
  EXPECT_EQ("bar", **(iter++));
  EXPECT_EQ("baz", **iter);
  ++iter;
  EXPECT_TRUE(const_proto_array_->pointer_end() == iter);
  EXPECT_EQ("baz", **(--const_proto_array_->pointer_end()));
}